

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-contact-ekf-flex-estimator-imu.cpp
# Opt level: O1

Vector * __thiscall
stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::getFlexibilityVector
          (FixedContactEKFFlexEstimatorIMU *this)

{
  ExtendedKalmanFilter *this_00;
  Vector *this_01;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  Index size;
  TimeSize TVar5;
  Vector *pVVar6;
  double *pdVar7;
  TimeIndex k;
  Index index;
  ulong uVar8;
  Index index_1;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  void *local_58;
  long local_50;
  Vector3 local_48;
  
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  TVar5 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)this_00);
  if (TVar5 < 1) {
LAB_0014c7c6:
    return &(this->super_EKFFlexibilityEstimatorBase).lastX_;
  }
  pVVar6 = EKFFlexibilityEstimatorBase::getFlexibilityVector
                     (&this->super_EKFFlexibilityEstimatorBase);
  this_01 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
  pdVar7 = (pVVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  uVar8 = (pVVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar8) {
    if ((long)uVar8 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this_01,uVar8,uVar8,1);
  }
  uVar11 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (uVar11 != uVar8) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                 );
  }
  pdVar3 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  uVar8 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar11) {
    lVar9 = 0;
    do {
      pdVar2 = pdVar7 + lVar9;
      dVar4 = pdVar2[1];
      pdVar1 = pdVar3 + lVar9;
      *pdVar1 = *pdVar2;
      pdVar1[1] = dVar4;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar11) {
    do {
      pdVar3[uVar8] = pdVar7[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  if (5 < (this->super_EKFFlexibilityEstimatorBase).lastX_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    pdVar7 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = pdVar7[3];
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = pdVar7[4];
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = pdVar7[5];
    kine::regulateOrientationVector((kine *)&local_58,&local_48);
    if (5 < (this->super_EKFFlexibilityEstimatorBase).lastX_.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      if (local_50 != 3) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                     );
      }
      pdVar7 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3;
      uVar8 = 3;
      if (((ulong)pdVar7 & 7) == 0) {
        uVar8 = (ulong)((uint)((ulong)pdVar7 >> 3) & 1);
      }
      uVar10 = (uint)uVar8 ^ 3;
      if (uVar8 != 0) {
        uVar11 = 0;
        do {
          pdVar7[uVar11] = *(double *)((long)local_58 + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      uVar11 = (uVar10 & 0xfffffffe) + uVar8;
      if (1 < uVar10) {
        do {
          pdVar3 = (double *)((long)local_58 + uVar8 * 8);
          dVar4 = pdVar3[1];
          pdVar7[uVar8] = *pdVar3;
          (pdVar7 + uVar8)[1] = dVar4;
          uVar8 = uVar8 + 2;
        } while (uVar8 < uVar11);
      }
      if ((uint)uVar11 < 3) {
        do {
          pdVar7[uVar11] = *(double *)((long)local_58 + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
      }
      free(local_58);
      k = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)this_00);
      ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,this_01,k);
      goto LAB_0014c7c6;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

const Vector & FixedContactEKFFlexEstimatorIMU::getFlexibilityVector()
{
  if(ekf_.getMeasurementsNumber() > 0)
  {
    lastX_ = EKFFlexibilityEstimatorBase::getFlexibilityVector();

    /// regulate the part of orientation vector in the state vector
    lastX_.segment(indexes::ori, 3) = kine::regulateOrientationVector(lastX_.segment(indexes::ori, 3));

    ekf_.setState(lastX_, ekf_.getCurrentTime());
  }
  return lastX_;
}